

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

GraphParts * __thiscall
QGraphicsAnchorLayoutPrivate::getGraphParts
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  anon_class_16_2_9ac84d3f_for__M_pred __pred;
  bool bVar1;
  AnchorVertex **ppAVar2;
  QList<QSimplexConstraint_*> *pQVar3;
  iterator o;
  GraphParts *in_RDI;
  long in_FS_OFFSET;
  bool dirty;
  AnchorData *edgeL2;
  AnchorData *edgeL1;
  GraphParts *result;
  iterator newEnd;
  anon_class_16_2_9ac84d3f_for__M_pred isMatch;
  iterator end;
  QSet<QSimplexVariable_*> trunkVariables;
  undefined4 in_stack_fffffffffffffea8;
  Orientation in_stack_fffffffffffffeac;
  GraphParts *in_stack_fffffffffffffeb0;
  QSet<QSimplexVariable_*> *in_stack_fffffffffffffeb8;
  QList<QSimplexConstraint_*> *in_stack_fffffffffffffec0;
  QSimplexVariable *local_128;
  GraphParts *in_stack_fffffffffffffee0;
  AnchorVertex *in_stack_fffffffffffffee8;
  iterator in_stack_fffffffffffffef0;
  iterator in_stack_fffffffffffffef8;
  const_iterator in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  AnchorData *local_b8;
  AnchorData *local_b0;
  const_iterator local_90;
  QSimplexConstraint **local_88;
  const_iterator local_80;
  QSimplexConstraint **local_78;
  GraphParts *local_70;
  undefined1 **local_68;
  QSimplexConstraint **local_60;
  iterator local_58;
  GraphParts *local_50;
  undefined1 **local_48;
  iterator local_40;
  QSimplexVariable *local_38;
  QSimplexVariable *local_30;
  undefined1 *local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0,0x30);
  (in_RDI->trunkConstraints).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->trunkConstraints).d.ptr = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->trunkConstraints).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->nonTrunkConstraints).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->nonTrunkConstraints).d.ptr = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->nonTrunkConstraints).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  GraphParts::GraphParts(in_stack_fffffffffffffeb0);
  local_b8 = (AnchorData *)0x0;
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                       in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  if (*ppAVar2 == (AnchorVertex *)0x0) {
    in_stack_fffffffffffffee0 =
         (GraphParts *)
         QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
         ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                       *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                        ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    in_stack_fffffffffffffee8 = *ppAVar2;
    QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
              ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    local_b0 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffeb0,(AnchorVertex *)in_stack_ffffffffffffff08.i,
                        (AnchorVertex *)in_stack_ffffffffffffff00.i);
  }
  else {
    in_stack_fffffffffffffef0.i =
         (QSimplexConstraint **)
         QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
         ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                       *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                        ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    in_stack_fffffffffffffef8.i = (QSimplexConstraint **)*ppAVar2;
    QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
              ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    local_b0 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffeb0,(AnchorVertex *)in_stack_ffffffffffffff08.i,
                        (AnchorVertex *)in_stack_ffffffffffffff00.i);
    in_stack_ffffffffffffff00.i =
         (QSimplexConstraint **)
         QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
         ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                       *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                        ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
    in_stack_ffffffffffffff08.i = (QSimplexConstraint **)*ppAVar2;
    QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
              ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    local_b8 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffeb0,(AnchorVertex *)in_stack_ffffffffffffff08.i,
                        (AnchorVertex *)in_stack_ffffffffffffff00.i);
  }
  pQVar3 = QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
                     ((QHVContainer<QList<QSimplexConstraint_*>_> *)in_stack_fffffffffffffeb0,
                      in_stack_fffffffffffffeac);
  QHVContainer<QList<QSimplexConstraint_*>_>::operator[]
            ((QHVContainer<QList<QSimplexConstraint_*>_> *)in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffeac);
  QList<QSimplexConstraint_*>::operator+(pQVar3,in_stack_fffffffffffffec0);
  QList<QSimplexConstraint_*>::operator=
            (&in_stack_fffffffffffffeb0->trunkConstraints,
             (QList<QSimplexConstraint_*> *)
             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  QList<QSimplexConstraint_*>::~QList((QList<QSimplexConstraint_*> *)0x93f784);
  local_28[0] = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QSimplexVariable_*>::QSet((QSet<QSimplexVariable_*> *)0x93f7a0);
  local_128 = (QSimplexVariable *)0x0;
  if (local_b0 != (AnchorData *)0x0) {
    local_128 = &local_b0->super_QSimplexVariable;
  }
  local_30 = local_128;
  QSet<QSimplexVariable_*>::operator+=
            (in_stack_fffffffffffffeb8,(QSimplexVariable **)in_stack_fffffffffffffeb0);
  if (local_b8 != (AnchorData *)0x0) {
    local_38 = (QSimplexVariable *)0x0;
    if (local_b8 != (AnchorData *)0x0) {
      local_38 = &local_b8->super_QSimplexVariable;
    }
    QSet<QSimplexVariable_*>::operator+=
              ((QSet<QSimplexVariable_*> *)local_b8,(QSimplexVariable **)in_stack_fffffffffffffeb0);
  }
  local_40.i = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = QList<QSimplexConstraint_*>::end(&in_stack_fffffffffffffeb0->trunkConstraints);
  do {
    local_48 = local_28;
    local_58.i = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
    local_50 = in_RDI;
    QList<QSimplexConstraint_*>::begin(&in_stack_fffffffffffffeb0->trunkConstraints);
    local_60 = local_40.i;
    local_70 = local_50;
    local_68 = local_48;
    __pred.trunkVariables = (QSet<QSimplexVariable_*> *)in_stack_fffffffffffffee8;
    __pred.result = in_stack_fffffffffffffee0;
    local_58 = std::
               remove_if<QList<QSimplexConstraint*>::iterator,QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation)::__0>
                         (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,__pred);
    local_78 = local_40.i;
    bVar1 = QList<QSimplexConstraint_*>::iterator::operator!=(&local_58,local_40);
    local_40.i = local_58.i;
  } while (bVar1);
  pQVar3 = &in_RDI->nonTrunkConstraints;
  local_88 = local_58.i;
  QList<QSimplexConstraint_*>::const_iterator::const_iterator(&local_80,local_58);
  o = QList<QSimplexConstraint_*>::end(pQVar3);
  QList<QSimplexConstraint_*>::const_iterator::const_iterator(&local_90,o);
  QList<QSimplexConstraint_*>::erase
            ((QList<QSimplexConstraint_*> *)local_b0,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00);
  QSet<QSimplexVariable_*>::~QSet((QSet<QSimplexVariable_*> *)0x93fa0d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QGraphicsAnchorLayoutPrivate::GraphParts
QGraphicsAnchorLayoutPrivate::getGraphParts(Qt::Orientation orientation)
{
    GraphParts result;

    Q_ASSERT(layoutFirstVertex[orientation] && layoutLastVertex[orientation]);

    AnchorData *edgeL1 = nullptr;
    AnchorData *edgeL2 = nullptr;

    // The layout may have a single anchor between Left and Right or two half anchors
    // passing through the center
    if (layoutCentralVertex[orientation]) {
        edgeL1 = graph[orientation].edgeData(layoutFirstVertex[orientation], layoutCentralVertex[orientation]);
        edgeL2 = graph[orientation].edgeData(layoutCentralVertex[orientation], layoutLastVertex[orientation]);
    } else {
        edgeL1 = graph[orientation].edgeData(layoutFirstVertex[orientation], layoutLastVertex[orientation]);
    }

    result.nonTrunkConstraints = constraints[orientation] + itemCenterConstraints[orientation];

    QSet<QSimplexVariable *> trunkVariables;

    trunkVariables += edgeL1;
    if (edgeL2)
        trunkVariables += edgeL2;

    bool dirty;
    auto end = result.nonTrunkConstraints.end();
    do {
        dirty = false;

        auto isMatch = [&result, &trunkVariables](QSimplexConstraint *c) -> bool {
            bool match = false;

            // Check if this constraint have some overlap with current
            // trunk variables...
            for (QSimplexVariable *ad : std::as_const(trunkVariables)) {
                if (c->variables.contains(ad)) {
                    match = true;
                    break;
                }
            }

            // If so, we add it to trunk, and erase it from the
            // remaining constraints.
            if (match) {
                result.trunkConstraints += c;
                for (auto jt = c->variables.cbegin(), end = c->variables.cend(); jt != end; ++jt)
                    trunkVariables.insert(jt.key());
                return true;
            } else {
                // Note that we don't erase the constraint if it's not
                // a match, since in a next iteration of a do-while we
                // can pass on it again and it will be a match.
                //
                // For example: if trunk share a variable with
                // remainingConstraints[1] and it shares with
                // remainingConstraints[0], we need a second iteration
                // of the do-while loop to match both.
                return false;
            }
        };
        const auto newEnd = std::remove_if(result.nonTrunkConstraints.begin(), end, isMatch);
        dirty = newEnd != end;
        end = newEnd;
    } while (dirty);

    result.nonTrunkConstraints.erase(end, result.nonTrunkConstraints.end());

    return result;
}